

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageFormatTests.cpp
# Opt level: O1

void __thiscall deqp::egl::Image::ImageFormatCase::deinit(ImageFormatCase *this)

{
  Library *pLVar1;
  pointer ppIVar2;
  pointer ppIVar3;
  long lVar4;
  
  pLVar1 = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  ppIVar2 = (this->m_apiContexts).
            super__Vector_base<deqp::egl::Image::ImageApi_*,_std::allocator<deqp::egl::Image::ImageApi_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppIVar3 = (this->m_apiContexts).
            super__Vector_base<deqp::egl::Image::ImageApi_*,_std::allocator<deqp::egl::Image::ImageApi_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (0 < (int)((ulong)((long)ppIVar3 - (long)ppIVar2) >> 3)) {
    lVar4 = 0;
    do {
      if (ppIVar2[lVar4] != (ImageApi *)0x0) {
        (*ppIVar2[lVar4]->_vptr_ImageApi[1])();
      }
      lVar4 = lVar4 + 1;
      ppIVar2 = (this->m_apiContexts).
                super__Vector_base<deqp::egl::Image::ImageApi_*,_std::allocator<deqp::egl::Image::ImageApi_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppIVar3 = (this->m_apiContexts).
                super__Vector_base<deqp::egl::Image::ImageApi_*,_std::allocator<deqp::egl::Image::ImageApi_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    } while (lVar4 < (int)((ulong)((long)ppIVar3 - (long)ppIVar2) >> 3));
  }
  if (ppIVar3 != ppIVar2) {
    (this->m_apiContexts).
    super__Vector_base<deqp::egl::Image::ImageApi_*,_std::allocator<deqp::egl::Image::ImageApi_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppIVar2;
  }
  if (this->m_surface != (EGLSurface)0x0) {
    (*pLVar1->_vptr_Library[0x16])(pLVar1,this->m_display);
    this->m_surface = (EGLSurface)0x0;
  }
  if (this->m_window != (NativeWindow *)0x0) {
    (*this->m_window->_vptr_NativeWindow[1])();
  }
  this->m_window = (NativeWindow *)0x0;
  if (this->m_display != (EGLDisplay)0x0) {
    (*pLVar1->_vptr_Library[0x34])(pLVar1);
    this->m_display = (EGLDisplay)0x0;
  }
  return;
}

Assistant:

void ImageFormatCase::deinit (void)
{
	const Library& egl = m_eglTestCtx.getLibrary();

	for (int contexNdx = 0 ; contexNdx < (int)m_apiContexts.size(); contexNdx++)
		delete m_apiContexts[contexNdx];

	m_apiContexts.clear();

	if (m_surface != EGL_NO_SURFACE)
	{
		egl.destroySurface(m_display, m_surface);
		m_surface = EGL_NO_SURFACE;
	}

	delete m_window;
	m_window = DE_NULL;

	if (m_display != EGL_NO_DISPLAY)
	{
		egl.terminate(m_display);
		m_display = EGL_NO_DISPLAY;
	}
}